

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__7>
                   (string *param_1,undefined8 param_2)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  GlobalFederateId *ele;
  const_iterator __end0;
  const_iterator __begin0;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range1;
  string *ret;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_40 [4];
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_8;
  
  local_19 = 0;
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffe6;
  this = param_1;
  local_18 = param_2;
  local_8 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  local_40[1]._M_current = (GlobalFederateId *)local_18;
  local_40[0]._M_current =
       (GlobalFederateId *)
       std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                 ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                  param_1);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::end
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)param_1)
  ;
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                           ((__normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                             *)this,(__normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                     *)param_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
    ::operator*(local_40);
    helics::CoreBroker::
    generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::$_7::
    operator()((anon_class_1_0_00000001 *)__str,(GlobalFederateId *)this);
    helics::generateJsonQuotedString(in_stack_ffffffffffffff88);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff70,__str);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff70,(char)((ulong)__str >> 0x38));
    __gnu_cxx::
    __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
    ::operator++(local_40);
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (this);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff70,(char)((ulong)__str >> 0x38));
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back(this);
    *pvVar3 = ']';
  }
  return param_1;
}

Assistant:

std::string generateStringVector(const X& data, Proc generator)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        ret.append(helics::generateJsonQuotedString(generator(ele)));
        ret.push_back(',');
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}